

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O2

void __thiscall cfd::core::Transaction::RemoveTxOut(Transaction *this,uint32_t index)

{
  AbstractTransaction::RemoveTxOut(&this->super_AbstractTransaction,index);
  ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::erase
            (&this->vout_,
             (this->vout_).super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
             _M_impl.super__Vector_impl_data._M_start + index);
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[10])(this,0x400);
  return;
}

Assistant:

void Transaction::RemoveTxOut(uint32_t index) {
  AbstractTransaction::RemoveTxOut(index);

  std::vector<TxOut>::const_iterator ite = vout_.cbegin();
  if (index != 0) {
    ite += index;
  }
  vout_.erase(ite);
  CallbackStateChange(kStateChangeRemoveTxOut);
}